

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<char16_t>::SubtractRange
          (CharSet<char16_t> *this,ArenaAllocator *allocator,Char lowerChar,Char higherChar)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ushort uVar10;
  uint l;
  ulong uVar11;
  
  uVar9 = CONCAT62(in_register_0000000a,higherChar) & 0xffffffff;
  uVar11 = CONCAT62(in_register_00000012,lowerChar) & 0xffffffff;
  uVar10 = (ushort)uVar11;
  if (uVar10 <= (ushort)uVar9) {
    l = (uint)CONCAT62(in_register_00000012,lowerChar);
    uVar8 = (uint)CONCAT62(in_register_0000000a,higherChar);
    if ((this->rep).compact.countPlusOne - 1 < 5) {
      uVar7 = 0;
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      while( true ) {
        if (4 < (this->rep).compact.countPlusOne - 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x1ef,"(IsCompact())","IsCompact()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
        if (*(int *)&this->rep - 1U <= uVar7) break;
        uVar4 = GetCompactCharU(this,uVar7);
        if ((uVar4 < l) || (uVar8 < uVar4)) {
          uVar7 = uVar7 + 1;
        }
        else {
          RemoveCompactChar(this,uVar7);
        }
      }
    }
    else if (higherChar == L'\xffff' && uVar10 == 0) {
      pCVar1 = (this->rep).full.root;
      if (pCVar1 != (CharSetNode *)0x0) {
        (**pCVar1->_vptr_CharSetNode)(pCVar1,allocator);
      }
      (this->rep).compact.countPlusOne = 1;
      (this->rep).compact.cs[0] = 0xffffffff;
      (this->rep).compact.cs[1] = 0xffffffff;
      (this->rep).compact.cs[2] = 0xffffffff;
      (this->rep).compact.cs[3] = 0xffffffff;
    }
    else {
      if ((ushort)lowerChar < 0x100) {
        uVar7 = 0xff;
        if (uVar8 < 0xff) {
          uVar7 = uVar8;
        }
        CharBitvec::ClearRange(&(this->rep).full.direct,l,uVar7);
      }
      pCVar1 = (this->rep).full.root;
      if (pCVar1 != (CharSetNode *)0x0) {
        iVar5 = (*pCVar1->_vptr_CharSetNode[3])(pCVar1,allocator,2,uVar11,uVar9);
        (this->rep).compact.countPlusOne = CONCAT44(extraout_var,iVar5);
      }
    }
  }
  return;
}

Assistant:

void CharSet<char16>::SubtractRange(ArenaAllocator* allocator, Char lowerChar, Char higherChar)
    {
        uint lowerValue = CTU(lowerChar);
        uint higherValue = CTU(higherChar);

        if (higherValue < lowerValue)
            return;

        if (IsCompact())
        {
            for (uint i = 0; i < this->GetCompactLength(); )
            {
                uint value = this->GetCompactCharU(i);

                if (value >= lowerValue && value <= higherValue)
                {
                    this->RemoveCompactChar(i);
                }
                else
                {
                    i++;
                }
            }
        }
        else if(lowerValue == 0 && higherValue == MaxUChar)
        {
            this->Clear(allocator);
        }
        else
        {
            if (lowerValue < CharSetNode::directSize)
            {
                uint maxDirectValue = min(higherValue, CharSetNode::directSize - 1);
                rep.full.direct.ClearRange(lowerValue, maxDirectValue);
            }

            if (rep.full.root != nullptr)
            {
                rep.full.root = rep.full.root->ClearRange(allocator, CharSetNode::levels - 1, lowerValue, higherValue);
            }
        }
    }